

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::finishSection(WasmBinaryWriter *this,int32_t start)

{
  BufferWithRandomAccess *pBVar1;
  pointer puVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  pointer ppVar6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  _Hash_node_base *p_Var12;
  int iVar13;
  long lVar14;
  
  pBVar1 = this->o;
  uVar5 = ((*(int *)&(pBVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
           *(int *)&(pBVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start) - start) - 5;
  lVar14 = 5;
  lVar9 = 1;
  lVar10 = (long)start;
  uVar11 = uVar5;
  do {
    lVar14 = lVar14 + -1;
    lVar9 = lVar9 + -1;
    (pBVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar10] = (0x7f < uVar11) << 7 | (byte)uVar11 & 0x7f;
    lVar10 = lVar10 + 1;
    bVar4 = 0x7f < uVar11;
    uVar11 = uVar11 >> 7;
  } while (bVar4);
  if (lVar14 != 0) {
    if (3 < (ulong)-lVar9) {
      __assert_fail("sizeFieldSize < MaxLEB32Bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x9a,"void wasm::WasmBinaryWriter::finishSection(int32_t)");
    }
    if (uVar5 != 0) {
      puVar2 = (this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(puVar2 + lVar10,puVar2 + (long)start + 5,(long)(int)uVar5);
    }
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(size_type)
                       ((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish +
                       (-lVar14 -
                       (long)(this_00->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start)));
    if (this->sourceMap != (ostream *)0x0) {
      uVar3 = this->sourceMapLocationsSizeAtSectionStart;
      ppVar6 = (this->sourceMapLocations).
               super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(this->sourceMapLocations).
                    super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 4;
      lVar10 = uVar8 - uVar3;
      if (uVar3 <= uVar8 && lVar10 != 0) {
        ppVar6 = ppVar6 + uVar3;
        do {
          ppVar6->first = ppVar6->first - lVar14;
          ppVar6 = ppVar6 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
    }
  }
  if (this->binaryLocationsSizeAtSectionStart !=
      (this->binaryLocations).expressions._M_h._M_element_count) {
    if (this->binaryLocationsSizeAtSectionStart != 0) {
      __assert_fail("binaryLocationsSizeAtSectionStart == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0xab,"void wasm::WasmBinaryWriter::finishSection(int32_t)");
    }
    iVar13 = start + 5;
    for (p_Var7 = (this->binaryLocations).expressions._M_h._M_before_begin._M_nxt;
        p_Var7 != (_Hash_node_base *)0x0; p_Var7 = p_Var7->_M_nxt) {
      p_Var7[2]._M_nxt =
           (_Hash_node_base *)
           CONCAT44((int)((ulong)p_Var7[2]._M_nxt >> 0x20) - iVar13,(int)p_Var7[2]._M_nxt - iVar13);
    }
    for (p_Var7 = (this->binaryLocations).functions._M_h._M_before_begin._M_nxt;
        p_Var7 != (_Hash_node_base *)0x0; p_Var7 = p_Var7->_M_nxt) {
      p_Var7[2]._M_nxt =
           (_Hash_node_base *)
           CONCAT44((int)((ulong)p_Var7[2]._M_nxt >> 0x20) - iVar13,(int)p_Var7[2]._M_nxt - iVar13);
      *(int *)&p_Var7[3]._M_nxt = *(int *)&p_Var7[3]._M_nxt - iVar13;
    }
    for (p_Var7 = (this->binaryLocations).delimiters._M_h._M_before_begin._M_nxt;
        p_Var7 != (_Hash_node_base *)0x0; p_Var7 = p_Var7->_M_nxt) {
      lVar10 = (long)&(p_Var7[2]._M_nxt)->_M_nxt +
               ((long)p_Var7[5]._M_nxt - (long)p_Var7[4]._M_nxt >> 2);
      if (lVar10 != 0) {
        lVar9 = -4;
        lVar14 = 0;
        do {
          p_Var12 = (_Hash_node_base *)((long)&(p_Var7[4]._M_nxt)->_M_nxt + lVar9);
          if (lVar14 == 0) {
            p_Var12 = p_Var7 + 3;
          }
          *(int *)&p_Var12->_M_nxt = *(int *)&p_Var12->_M_nxt - iVar13;
          lVar14 = lVar14 + 1;
          lVar9 = lVar9 + 4;
        } while (lVar10 != lVar14);
      }
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::finishSection(int32_t start) {
  // section size does not include the reserved bytes of the size field itself
  int32_t size = o.size() - start - MaxLEB32Bytes;
  auto sizeFieldSize = o.writeAt(start, U32LEB(size));
  // We can move things back if the actual LEB for the size doesn't use the
  // maximum 5 bytes. In that case we need to adjust offsets after we move
  // things backwards.
  auto adjustmentForLEBShrinking = MaxLEB32Bytes - sizeFieldSize;
  if (adjustmentForLEBShrinking) {
    // we can save some room, nice
    assert(sizeFieldSize < MaxLEB32Bytes);
    std::move(&o[start] + MaxLEB32Bytes,
              &o[start] + MaxLEB32Bytes + size,
              &o[start] + sizeFieldSize);
    o.resize(o.size() - adjustmentForLEBShrinking);
    if (sourceMap) {
      for (auto i = sourceMapLocationsSizeAtSectionStart;
           i < sourceMapLocations.size();
           ++i) {
        sourceMapLocations[i].first -= adjustmentForLEBShrinking;
      }
    }
  }

  if (binaryLocationsSizeAtSectionStart != binaryLocations.expressions.size()) {
    // We added the binary locations, adjust them: they must be relative
    // to the code section.
    assert(binaryLocationsSizeAtSectionStart == 0);
    // The section type byte is right before the LEB for the size; we want
    // offsets that are relative to the body, which is after that section type
    // byte and the the size LEB.
    auto body = start + sizeFieldSize;
    // Offsets are relative to the body of the code section: after the
    // section type byte and the size.
    // Everything was moved by the adjustment, track that. After this,
    // we are at the right absolute address.
    // We are relative to the section start.
    auto totalAdjustment = adjustmentForLEBShrinking + body;
    for (auto& [_, locations] : binaryLocations.expressions) {
      locations.start -= totalAdjustment;
      locations.end -= totalAdjustment;
    }
    for (auto& [_, locations] : binaryLocations.functions) {
      locations.start -= totalAdjustment;
      locations.declarations -= totalAdjustment;
      locations.end -= totalAdjustment;
    }
    for (auto& [_, locations] : binaryLocations.delimiters) {
      for (auto& item : locations) {
        item -= totalAdjustment;
      }
    }
  }
}